

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database.cc
# Opt level: O2

FileDescriptorProto * __thiscall
google::protobuf::SimpleDescriptorDatabase::
DescriptorIndex<const_google::protobuf::FileDescriptorProto_*>::FindExtension
          (DescriptorIndex<const_google::protobuf::FileDescriptorProto_*> *this,
          string *containing_type,int field_number)

{
  second_type pFVar1;
  second_type *ppFVar2;
  second_type local_48;
  first_type local_40;
  
  std::__cxx11::string::string((string *)&local_40,(string *)containing_type);
  local_48 = (second_type)0x0;
  local_40.second = field_number;
  ppFVar2 = FindWithDefault<std::map<std::pair<std::__cxx11::string,int>,google::protobuf::FileDescriptorProto_const*,std::less<std::pair<std::__cxx11::string,int>>,std::allocator<std::pair<std::pair<std::__cxx11::string,int>const,google::protobuf::FileDescriptorProto_const*>>>>
                      (&this->by_extension_,&local_40,&local_48);
  pFVar1 = *ppFVar2;
  std::__cxx11::string::~string((string *)&local_40);
  return pFVar1;
}

Assistant:

Value SimpleDescriptorDatabase::DescriptorIndex<Value>::FindExtension(
    const std::string& containing_type, int field_number) {
  return FindWithDefault(
      by_extension_, std::make_pair(containing_type, field_number), Value());
}